

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_loadDictionary_advanced
                 (ZSTD_DCtx *dctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_customMem customMem;
  ZSTD_DDict *pZVar1;
  long in_RDX;
  long in_RSI;
  size_t in_RDI;
  undefined8 uStack0000000000000010;
  undefined8 uStack0000000000000018;
  void *in_stack_fffffffffffffff8;
  size_t sVar2;
  
  if (*(int *)(in_RDI + 0x7618) == 0) {
    ZSTD_clearDict((ZSTD_DCtx *)0x28af22);
    if ((in_RSI != 0) && (in_RDX != 0)) {
      customMem.opaque._0_4_ = dictContentType;
      customMem.customAlloc = (ZSTD_allocFunction)uStack0000000000000010;
      customMem.customFree = (ZSTD_freeFunction)uStack0000000000000018;
      customMem.opaque._4_4_ = dictLoadMethod;
      pZVar1 = ZSTD_createDDict_advanced
                         (in_stack_fffffffffffffff8,in_RDI,
                          (ZSTD_dictLoadMethod_e)((ulong)in_RSI >> 0x20),
                          (ZSTD_dictContentType_e)in_RSI,customMem);
      *(ZSTD_DDict **)(in_RDI + 0x75e8) = pZVar1;
      if (*(long *)(in_RDI + 0x75e8) == 0) {
        return 0xffffffffffffffc0;
      }
      *(undefined8 *)(in_RDI + 0x75f0) = *(undefined8 *)(in_RDI + 0x75e8);
      *(undefined4 *)(in_RDI + 0x7600) = 0xffffffff;
    }
    sVar2 = 0;
  }
  else {
    sVar2 = 0xffffffffffffffc4;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_DCtx_loadDictionary_advanced(ZSTD_DCtx* dctx,
                                   const void* dict, size_t dictSize,
                                         ZSTD_dictLoadMethod_e dictLoadMethod,
                                         ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (dict && dictSize != 0) {
        dctx->ddictLocal = ZSTD_createDDict_advanced(dict, dictSize, dictLoadMethod, dictContentType, dctx->customMem);
        RETURN_ERROR_IF(dctx->ddictLocal == NULL, memory_allocation, "NULL pointer!");
        dctx->ddict = dctx->ddictLocal;
        dctx->dictUses = ZSTD_use_indefinitely;
    }
    return 0;
}